

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O1

bool CB_ADF::update_statistics(vw *all,cb_adf *c,example *ec,multi_ex *ec_seq)

{
  float fVar1;
  uint32_t uVar2;
  wclass *pwVar3;
  bool bVar4;
  pointer ppeVar5;
  ulong uVar6;
  wclass *pwVar7;
  ulong uVar8;
  size_t num_features;
  bool bVar9;
  float fVar10;
  
  ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = ((ec->pred).a_s._begin)->action;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppeVar5) {
    uVar6 = 0;
    num_features = 0;
  }
  else {
    uVar8 = 0;
    num_features = 0;
    do {
      bVar4 = CB::ec_is_example_header(ppeVar5[uVar8]);
      if (!bVar4) {
        num_features = num_features +
                       (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar8]->num_features;
      }
      uVar8 = uVar8 + 1;
      ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppeVar5 >> 3;
    } while (uVar8 < uVar6);
  }
  fVar1 = (c->gen_cs).known_cost.probability;
  fVar10 = 0.0;
  bVar4 = 0.0 < fVar1;
  if (0.0 < fVar1) {
    pwVar7 = (c->gen_cs).pred_scores.costs._begin;
    pwVar3 = (c->gen_cs).pred_scores.costs._end;
    bVar9 = pwVar7 == pwVar3;
    if (!bVar9) {
      bVar9 = false;
      do {
        if (pwVar7->class_index == uVar2) {
          if ((c->gen_cs).known_cost.action == uVar2) {
            fVar10 = ((c->gen_cs).known_cost.cost - pwVar7->x) / (c->gen_cs).known_cost.probability;
          }
          else {
            fVar10 = 0.0;
          }
          fVar10 = pwVar7->x + fVar10;
        }
        if (pwVar7->class_index == uVar2) break;
        pwVar7 = pwVar7 + 1;
        bVar9 = pwVar7 == pwVar3;
      } while (!bVar9);
    }
    if ((bVar9) && (fVar10 = 0.0, (c->gen_cs).known_cost.action == uVar2)) {
      fVar10 = (c->gen_cs).known_cost.cost / (c->gen_cs).known_cost.probability;
    }
  }
  if (uVar6 != 0) {
    uVar8 = 0;
    do {
      bVar4 = (bool)(bVar4 & ppeVar5[uVar8]->test_only);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  shared_data::update(all->sd,bVar4,0.0 < fVar1,fVar10,ec->weight,num_features);
  return 0.0 < fVar1;
}

Assistant:

bool update_statistics(vw& all, cb_adf& c, example& ec, multi_ex* ec_seq)
{
  size_t num_features = 0;

  uint32_t action = ec.pred.a_s[0].action;
  for (size_t i = 0; i < (*ec_seq).size(); i++)
    if (!CB::ec_is_example_header(*(*ec_seq)[i]))
      num_features += (*ec_seq)[i]->num_features;

  float loss = 0.;

  bool labeled_example = true;
  if (c.gen_cs.known_cost.probability > 0)
    loss = get_unbiased_cost(&(c.gen_cs.known_cost), c.gen_cs.pred_scores, action);
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq->size(); i++) holdout_example &= (*ec_seq)[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);
  return labeled_example;
}